

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

IntrusiveList<SynModuleImport> ParseImports(ParseContext *ctx)

{
  IntrusiveList<SynModuleImport> IVar1;
  SynModuleImport *node;
  IntrusiveList<SynModuleImport> imports;
  IntrusiveList<SynModuleImport> local_28;
  
  local_28.head = (SynModuleImport *)0x0;
  local_28.tail = (SynModuleImport *)0x0;
  while (ctx->currentLexeme->type == lex_import) {
    node = ParseImport(ctx);
    if (node != (SynModuleImport *)0x0) {
      IntrusiveList<SynModuleImport>::push_back(&local_28,node);
    }
  }
  IVar1.tail = local_28.tail;
  IVar1.head = local_28.head;
  return IVar1;
}

Assistant:

IntrusiveList<SynModuleImport> ParseImports(ParseContext &ctx)
{
	IntrusiveList<SynModuleImport> imports;

	while(ctx.At(lex_import))
	{
		if(SynModuleImport *import = ParseImport(ctx))
			imports.push_back(import);
	}

	return imports;
}